

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::ubjson::
basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::begin_object(basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
               *this,json_visitor *visitor,error_code *ec)

{
  binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  byte bVar4;
  type_conflict2 tVar5;
  ubjson_errc __e;
  uint8_t b;
  parse_mode local_34;
  size_t length;
  
  iVar2 = this->nesting_depth_;
  this->nesting_depth_ = iVar2 + 1;
  if (iVar2 < *(int *)((this->options_)._vptr_ubjson_decode_options[-3] + 8 +
                      (long)&(this->options_)._vptr_ubjson_decode_options)) {
    puVar3 = (this->source_).current_._M_current;
    if (puVar3 == (this->source_).end_._M_current) {
      __e = unexpected_eof;
    }
    else {
      this_00 = &this->source_;
      uVar1 = *puVar3;
      if (uVar1 == '#') {
        binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::ignore(this_00,1);
        length = get_length(this,ec);
        if (ec->_M_value != 0) {
          return;
        }
        if (length <= (this->options_).max_items_) {
          local_34 = map_key;
          std::vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>::
          emplace_back<jsoncons::ubjson::parse_mode,unsigned_long&>
                    ((vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>
                      *)&this->state_stack_,&local_34,&length);
          (*visitor->_vptr_basic_json_visitor[4])(visitor,length,0,this,ec);
          goto LAB_00613de5;
        }
        __e = max_items_exceeded;
      }
      else {
        if (uVar1 != '$') {
          length = CONCAT44(length._4_4_,9);
          local_34 = root;
          std::vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>::
          emplace_back<jsoncons::ubjson::parse_mode,int>
                    ((vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>
                      *)&this->state_stack_,(parse_mode *)&length,(int *)&local_34);
          (*visitor->_vptr_basic_json_visitor[3])(visitor,0,this,ec);
LAB_00613de5:
          this->more_ = (bool)(this->cursor_mode_ ^ 1);
          return;
        }
        binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::ignore(this_00,1);
        tVar5 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::read<std::random_access_iterator_tag>(this_00,&b,1);
        __e = unexpected_eof;
        if ((tVar5 != 0) &&
           (puVar3 = (this->source_).current_._M_current, puVar3 != (this->source_).end_._M_current)
           ) {
          if (*puVar3 == '#') {
            binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::ignore(this_00,1);
            length = get_length(this,ec);
            if (ec->_M_value != 0) {
              return;
            }
            if ((this->options_).max_items_ < length) {
              std::error_code::operator=(ec,max_items_exceeded);
              bVar4 = false;
            }
            else {
              local_34 = strongly_typed_map_key;
              std::
              vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>::
              emplace_back<jsoncons::ubjson::parse_mode,unsigned_long&,unsigned_char&>
                        ((vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>
                          *)&this->state_stack_,&local_34,&length,&b);
              (*visitor->_vptr_basic_json_visitor[4])(visitor,length,0,this,ec);
              bVar4 = this->cursor_mode_ ^ 1;
            }
            this->more_ = (bool)bVar4;
            return;
          }
          __e = count_required_after_type;
        }
      }
    }
  }
  else {
    __e = max_nesting_depth_exceeded;
  }
  std::error_code::operator=(ec,__e);
  this->more_ = false;
  return;
}

Assistant:

void begin_object(json_visitor& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = ubjson_errc::max_nesting_depth_exceeded;
            more_ = false;
            return;
        } 

        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = ubjson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        if (c.value == jsoncons::ubjson::ubjson_type::type_marker)
        {
            source_.ignore(1);
            uint8_t b;
            if (source_.read(&b, 1) == 0)
            {
                ec = ubjson_errc::unexpected_eof;
                more_ = false;
                return;
            }
            c = source_.peek();
            if (JSONCONS_UNLIKELY(c.eof))
            {
                ec = ubjson_errc::unexpected_eof;
                more_ = false;
                return;
            }
            if (c.value == jsoncons::ubjson::ubjson_type::count_marker)
            {
                source_.ignore(1);
                std::size_t length = get_length(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                if (length > options_.max_items())
                {
                    ec = ubjson_errc::max_items_exceeded;
                    more_ = false;
                    return;
                }
                state_stack_.emplace_back(parse_mode::strongly_typed_map_key,length,b);
                visitor.begin_object(length, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
            }
            else
            {
                ec = ubjson_errc::count_required_after_type;
                more_ = false;
                return;
            }
        }
        else
        {
            c = source_.peek();
            if (JSONCONS_UNLIKELY(c.eof))
            {
                ec = ubjson_errc::unexpected_eof;
                more_ = false;
                return;
            }
            if (c.value == jsoncons::ubjson::ubjson_type::count_marker)
            {
                source_.ignore(1);
                std::size_t length = get_length(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                if (length > options_.max_items())
                {
                    ec = ubjson_errc::max_items_exceeded;
                    more_ = false;
                    return;
                }
                state_stack_.emplace_back(parse_mode::map_key,length);
                visitor.begin_object(length, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
            }
            else
            {
                state_stack_.emplace_back(parse_mode::indefinite_map_key,0);
                visitor.begin_object(semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
            }
        }
    }